

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLtree.c
# Opt level: O1

xmlCharEncodingHandler * htmlFindOutputEncoder(char *encoding)

{
  int iVar1;
  xmlCharEncodingHandler *handler;
  xmlCharEncodingHandler *local_10;
  
  local_10 = (xmlCharEncodingHandler *)0x0;
  if (encoding == (char *)0x0) {
    xmlOpenCharEncodingHandler("HTML",1,&local_10);
  }
  else {
    iVar1 = xmlOpenCharEncodingHandler(encoding,1,&local_10);
    if (iVar1 != 0) {
      iVar1 = xmlRaiseError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,
                            (void *)0x0,(xmlNode *)0x0,7,0x57b,XML_ERR_ERROR,(char *)0x0,0,encoding,
                            (char *)0x0,(char *)0x0,0,0,"unknown encoding %s\n",encoding);
      if (iVar1 < 0) {
        xmlRaiseMemoryError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,7,
                            (xmlError *)0x0);
      }
    }
  }
  return local_10;
}

Assistant:

static xmlCharEncodingHandler *
htmlFindOutputEncoder(const char *encoding) {
    xmlCharEncodingHandler *handler = NULL;

    if (encoding != NULL) {
        int res;

        res = xmlOpenCharEncodingHandler(encoding, /* output */ 1,
                                         &handler);
        if (res != XML_ERR_OK)
            htmlSaveErr(XML_SAVE_UNKNOWN_ENCODING, NULL, encoding);
    } else {
        /*
         * Fallback to HTML when the encoding is unspecified
         */
        xmlOpenCharEncodingHandler("HTML", /* output */ 1, &handler);
    }

    return(handler);
}